

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnRelocCount
          (BinaryReaderObjdump *this,Index count,Index section_index)

{
  string_view sVar1;
  string_view sVar2;
  
  BinaryReaderObjdumpBase::OnRelocCount(&this->super_BinaryReaderObjdumpBase,count,section_index);
  sVar1 = BinaryReaderObjdumpBase::GetSectionName
                    (&this->super_BinaryReaderObjdumpBase,section_index);
  sVar2 = BinaryReaderObjdumpBase::GetSectionName
                    (&this->super_BinaryReaderObjdumpBase,section_index);
  PrintDetails(this,"  - relocations for section: %d (%.*s) [%d]\n",(ulong)section_index,
               sVar1._M_len & 0xffffffff,sVar2._M_str,count);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnRelocCount(Index count, Index section_index) {
  BinaryReaderObjdumpBase::OnRelocCount(count, section_index);
  PrintDetails("  - relocations for section: %d (" PRIstringview ") [%d]\n",
               section_index,
               WABT_PRINTF_STRING_VIEW_ARG(GetSectionName(section_index)),
               count);
  return Result::Ok;
}